

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O1

bool __thiscall OIDType::generateInternalData(OIDType *this)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator iVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  byte bVar10;
  uchar *__args;
  ulong uVar11;
  ulong uVar12;
  char *__s;
  uint8_t temp [10];
  long tempVal;
  uchar local_48 [16];
  long local_38;
  
  lVar7 = std::__cxx11::string::find((char *)&this->_value,0x10e54a,0);
  if (lVar7 == 0) {
    puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    local_48[0] = 0x2b;
    iVar3._M_current =
         (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (&this->data,iVar3,local_48);
    }
    else {
      *iVar3._M_current = '+';
      ppuVar1 = &(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    __s = (this->_value)._M_dataplus._M_p + 5;
    do {
      if (*__s == '\0') goto LAB_00106c86;
      pcVar8 = strchr(__s,0x2e);
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[0] = '\0';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      iVar6 = __isoc99_sscanf(__s,"%ld.",&local_38);
      lVar7 = local_38;
      if (iVar6 == 0) {
        cVar5 = '\x01';
      }
      else {
        sVar9 = recurse_longform(local_38,local_48,10);
        bVar4 = (byte)lVar7;
        bVar10 = bVar4 + 0x7f;
        if (-1 < lVar7) {
          bVar10 = bVar4;
        }
        uVar11 = (sVar9 << 0x20) + 0x100000000;
        local_48[(int)sVar9] = bVar4 - (bVar10 & 0x80);
        uVar12 = uVar11 >> 0x20;
        __args = local_48;
        if ((int)(uVar11 >> 0x20) != 0 && -1 < (long)uVar11) {
          do {
            iVar3._M_current =
                 (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->data,iVar3,
                         __args);
            }
            else {
              *iVar3._M_current = *__args;
              ppuVar1 = &(this->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            uVar12 = uVar12 - 1;
            __args = __args + 1;
          } while (uVar12 != 0);
        }
        if (pcVar8 != (char *)0x0) {
          __s = pcVar8 + 1;
        }
        cVar5 = (pcVar8 == (char *)0x0) * '\x03';
      }
    } while (cVar5 == '\0');
    if (cVar5 == '\x03') {
LAB_00106c86:
      (this->super_BER_CONTAINER)._length =
           *(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      return true;
    }
  }
  else {
    this->valid = false;
  }
  return false;
}

Assistant:

bool OIDType::generateInternalData() {
    if(_value.find(".1.3.") != 0) { this->valid = false; return false; }; // Invalid OID

    this->data.clear();
    this->data.push_back(0x2b); // first byte

    char* valuePtr = &_value[5];

    while(*valuePtr != 0){
        bool toBreak = false;
        char* startNum = valuePtr;

        // Find the end of this item (next dot or end of string)
        char* endNum = strchr(startNum, '.');
        if(!endNum) {
            toBreak = true;
        }

        long tempVal;
        uint8_t temp[10] = {0};
        if(sscanf(startNum, "%ld.", &tempVal)){
            int encoded_length = encode_ber_longform_integer(temp, tempVal, 10);

            for(int i = 0; i < encoded_length; i++){
                this->data.push_back(temp[i]);
            }

            if(toBreak) break;
            valuePtr = endNum+1;
        } else {
            return false;
        }
    }

    this->_length = this->data.size();
    return true;
}